

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O1

satoko_t * Gia_ManSatokoFromDimacs(char *pFileName,satoko_opts_t *opts)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *__ptr;
  Vec_Int_t *p;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  satoko_t *local_48;
  
  local_48 = satoko_create();
  __ptr = (Vec_Int_t *)Extra_FileReadContents(pFileName);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  iVar8 = 0;
  pVVar10 = __ptr;
  do {
    cVar2 = (char)pVVar10->nCap;
    if ((cVar2 == 'c') || (cVar2 == 'p')) {
      pcVar9 = (char *)((long)&pVVar10[-1].pArray + 7);
      do {
        pcVar1 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
      } while (*pcVar1 != '\n');
    }
    else {
      if (cVar2 == '\0') {
        if (__ptr != (Vec_Int_t *)0x0) {
          free(__ptr);
        }
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        goto LAB_007a9f3d;
      }
      while (uVar7 = (ulong)(byte)pVVar10->nCap, uVar7 < 0x2e) {
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
          if (uVar7 == 0x2d) {
            pVVar10 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
            iVar5 = 1;
            goto LAB_007a9e77;
          }
          break;
        }
        pVVar10 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
      }
      iVar5 = 0;
LAB_007a9e77:
      uVar7 = (ulong)((char)pVVar10->nCap == '+');
      iVar4 = atoi((char *)((long)&pVVar10->nCap + uVar7));
      if (iVar4 == 0) {
        iVar5 = p->nSize;
        if (0 < iVar5) {
          satoko_setnvars(local_48,iVar8 + 1);
          piVar6 = p->pArray;
          iVar5 = satoko_add_clause(local_48,piVar6,iVar5);
          if (iVar5 == 0) {
            satoko_destroy(local_48);
            if (piVar6 != (int *)0x0) {
              free(piVar6);
              p->pArray = (int *)0x0;
            }
            free(p);
            local_48 = (satoko_t *)0x0;
            p = __ptr;
            if (__ptr != (Vec_Int_t *)0x0) {
LAB_007a9f3d:
              free(p);
            }
            return local_48;
          }
          p->nSize = 0;
        }
      }
      else {
        if (iVar4 < 1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar3 = iVar4 + -1;
        if (iVar4 + -1 < iVar8) {
          iVar3 = iVar8;
        }
        iVar8 = iVar3;
        Vec_IntPush(p,iVar5 + iVar4 * 2 + -2);
      }
      pcVar9 = (char *)((long)pVVar10 + (uVar7 - 1));
      do {
        pcVar1 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
      } while ((byte)(*pcVar1 - 0x30U) < 10);
    }
    pVVar10 = (Vec_Int_t *)(pcVar9 + 1);
  } while( true );
}

Assistant:

satoko_t * Gia_ManSatokoFromDimacs( char * pFileName, satoko_opts_t * opts )
{
    satoko_t * pSat = satoko_create();
    char * pBuffer = Extra_FileReadContents( pFileName );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    char * pTemp; int fComp, Var, VarMax = 0;
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) 
        {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( Vec_IntSize(vLits) > 0 ) 
            {
                satoko_setnvars( pSat, VarMax+1 );
                if ( !satoko_add_clause( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
                {
                    satoko_destroy(pSat);
                    Vec_IntFree( vLits );
                    ABC_FREE( pBuffer );
                    return NULL;
                }
                Vec_IntClear( vLits );
            }
        }
        else 
        {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            Vec_IntPush( vLits, Abc_Var2Lit(Var, fComp) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
    Vec_IntFree( vLits );
    return pSat;
}